

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O2

void __thiscall glcts::TextureBufferOperations::initSecondPhase(TextureBufferOperations *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  TestError *this_00;
  char *this_01;
  undefined8 local_c8;
  float local_c0;
  float local_bc;
  char *vsCode;
  char *fsCode;
  string vsSource;
  string fsSource;
  GLfloat vertices [16];
  long lVar5;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error generating vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0xc4);
  (**(code **)(lVar5 + 0x6d0))(1,&this->m_fbo_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error genertaing framebuffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,200);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_to_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error genertaing texture buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0xcc);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_to_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0xcf);
  (**(code **)(lVar5 + 0x1380))(0xde1,1,0x8d82,this->m_n_vectors_in_buffer_texture,1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error allocating texture object\'s texel data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0xd2);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2600);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error setting value for GL_TEXTURE_MAG_FILTER parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0xd6);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2600);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error setting value for GL_TEXTURE_MIN_FILTER parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0xd8);
  (**(code **)(lVar5 + 0xb8))(0xde1,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0xdb);
  GVar4 = (**(code **)(lVar5 + 0x3c8))();
  this->m_po_vs_fs_id = GVar4;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0xdf);
  GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"Error creating fragment shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0xe2);
  GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  this_01 = "Error creating vertex shader object!";
  glu::checkError(dVar3,"Error creating vertex shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0xe5);
  getFragmentShaderCode_abi_cxx11_(&fsSource,(TextureBufferOperations *)this_01);
  getVertexShaderCode_abi_cxx11_(&vsSource,(TextureBufferOperations *)this_01);
  fsCode = fsSource._M_dataplus._M_p;
  vsCode = vsSource._M_dataplus._M_p;
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_vs_fs_id,this->m_fs_id,1,&fsCode,
                     this->m_vs_id,1,&vsCode,(bool *)0x0);
  if (bVar1) {
    vertices[0xc] = 1.0;
    vertices[0xd] = 1.0;
    vertices[0xe] = 0.0;
    vertices[0xf] = 1.0;
    vertices[8] = 1.0;
    vertices[9] = -1.0;
    vertices[10] = 0.0;
    vertices[0xb] = 1.0;
    vertices[4] = -1.0;
    vertices[5] = 1.0;
    vertices[6] = 0.0;
    vertices[7] = 1.0;
    vertices[0] = -1.0;
    vertices[1] = -1.0;
    vertices[2] = 0.0;
    vertices[3] = 1.0;
    (**(code **)(lVar5 + 0x6c8))(1,&this->m_vbo_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error generating buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0xf8);
    (**(code **)(lVar5 + 0x40))(0x8892,this->m_vbo_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error binding buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0xfb);
    (**(code **)(lVar5 + 0x150))(0x8892,0x40,vertices,0x88e4);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error setting data for buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0xfe);
    local_c8 = 0;
    local_c0 = (float)this->m_n_vectors_in_buffer_texture;
    local_bc = local_c0;
    (**(code **)(lVar5 + 0x6c8))(1,&this->m_vbo_indicies_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error generating buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x106);
    (**(code **)(lVar5 + 0x40))(0x8892,this->m_vbo_indicies_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error binding buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x109);
    (**(code **)(lVar5 + 0x150))(0x8892,0x10,&local_c8,0x88e4);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error seting data for buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x10c);
    (**(code **)(lVar5 + 0x40))(0x8892,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error binding buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x10f);
    std::__cxx11::string::~string((string *)&vsSource);
    std::__cxx11::string::~string((string *)&fsSource);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Could not create a program from valid vertex/fragment shader source!",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
             ,0xef);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferOperations::initSecondPhase(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating vertex array object!");

	/* Create framebuffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error genertaing framebuffer object!");

	/* Prepare texture object */
	gl.genTextures(1, &m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error genertaing texture buffer!");

	gl.bindTexture(GL_TEXTURE_2D, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32I, m_n_vectors_in_buffer_texture /* width */, 1 /* height */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating texture object's texel data!");

	/* Set GL_TEXTURE_MAG_FILTER and GL_TEXTURE_MIN_FILTER parameters values to GL_NEAREST*/
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for GL_TEXTURE_MAG_FILTER parameter!");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for GL_TEXTURE_MIN_FILTER parameter!");

	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	/* Create program object */
	m_po_vs_fs_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating fragment shader object!");

	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating vertex shader object!");

	std::string fsSource = getFragmentShaderCode();
	std::string vsSource = getVertexShaderCode();

	const char* fsCode = fsSource.c_str();
	const char* vsCode = vsSource.c_str();

	if (!buildProgram(m_po_vs_fs_id, m_fs_id, 1, &fsCode, m_vs_id, 1, &vsCode))
	{
		TCU_FAIL("Could not create a program from valid vertex/fragment shader source!");
	}

	/* Full screen quad */
	glw::GLfloat vertices[] = { -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 1.0f, 0.0f, 1.0f,
								1.0f,  -1.0f, 0.0f, 1.0f, 1.0f,  1.0f, 0.0f, 1.0f };

	/* Generate buffer object */
	gl.genBuffers(1, &m_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	/* Bind buffer object */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
	/* Set data for buffer object */
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting data for buffer object!");

	/* Indicies */
	glw::GLfloat indicies[] = { 0.f, 0.f, static_cast<glw::GLfloat>(m_n_vectors_in_buffer_texture) * 1.f,
								static_cast<glw::GLfloat>(m_n_vectors_in_buffer_texture) * 1.f };

	/* Generate buffer object */
	gl.genBuffers(1, &m_vbo_indicies_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	/* Bind buffer object */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo_indicies_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
	/* Set data for buffer object */
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(indicies), indicies, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error seting data for buffer object!");

	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object!");
}